

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O1

bool density_tests::detail::
     PutUInt8<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
     ::put(conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
           *queue,EasyRandom *i_rand)

{
  result_type_conflict1 rVar1;
  result_type_conflict rVar2;
  _Adaptor<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_double>
  __aurng;
  double dVar3;
  ElementType val;
  runtime_type<> type;
  undefined1 local_21;
  runtime_type local_20;
  param_type local_18;
  
  dVar3 = std::
          generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                    (&i_rand->m_rand);
  if (dVar3 < 0.9) {
    local_18._M_a = 0;
    local_18._M_b = 1;
    rVar2 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&local_18,&i_rand->m_rand,
                       (param_type *)&local_18);
    if (rVar2 == 0) {
      local_18._M_a._0_1_ = 8;
      density::
      lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)0>
      ::emplace<unsigned_char,unsigned_char>
                ((lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)0>
                  *)queue,(uchar *)&local_18);
    }
    else {
      local_18._M_a._0_1_ = 8;
      density::
      lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)0>
      ::reentrant_emplace<unsigned_char,unsigned_char>
                ((lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)0>
                  *)queue,(uchar *)&local_18);
    }
  }
  else {
    local_21 = 8;
    local_20.m_feature_table =
         (tuple_type *)
         density::detail::
         FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,unsigned_char>
         ::s_table;
    local_18._M_a = 0;
    local_18._M_b = 3;
    rVar1 = std::uniform_int_distribution<unsigned_int>::operator()
                      ((uniform_int_distribution<unsigned_int> *)&local_18,&i_rand->m_rand,&local_18
                      );
    switch(rVar1) {
    case 0:
      density::
      lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
      ::dyn_push_copy((lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
                       *)queue,&local_20,&local_21);
      break;
    case 1:
      density::
      lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
      ::dyn_push_move((lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
                       *)queue,&local_20,&local_21);
      break;
    case 2:
      density::
      lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
      ::reentrant_dyn_push_copy
                ((lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
                  *)queue,&local_20,&local_21);
      break;
    case 3:
      density::
      lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
      ::reentrant_dyn_push_move
                ((lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
                  *)queue,&local_20,&local_21);
    }
  }
  return true;
}

Assistant:

static bool put(QUEUE & queue, EasyRandom & i_rand)
            {
                if (i_rand.get_bool(.9))
                {
                    if (i_rand.get_bool())
                        queue.template emplace<uint8_t>(static_cast<uint8_t>(8));
                    else
                        queue.template reentrant_emplace<uint8_t>(static_cast<uint8_t>(8));
                }
                else
                {
                    ElementType val  = 8;
                    auto        type = QUEUE::runtime_type::template make<ElementType>();
                    switch (i_rand.get_int<unsigned>(0, 3))
                    {
                    case 0:
                        queue.dyn_push_copy(type, &val);
                        break;
                    case 1:
                        queue.dyn_push_move(type, &val);
                        break;
                    case 2:
                        queue.reentrant_dyn_push_copy(type, &val);
                        break;
                    case 3:
                        queue.reentrant_dyn_push_move(type, &val);
                        break;
                    }
                }
                return true;
            }